

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O3

void __thiscall Assimp::ObjFile::Model::~Model(Model *this)

{
  Object *this_00;
  pointer ppOVar1;
  Mesh *this_01;
  pointer ppMVar2;
  undefined8 *puVar3;
  void *pvVar4;
  pointer paVar5;
  pointer pcVar6;
  _Rb_tree_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppOVar9;
  pointer ppMVar10;
  
  ppOVar9 = (this->m_Objects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar9 !=
      (this->m_Objects).
      super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppOVar9;
      if (this_00 != (Object *)0x0) {
        Object::~Object(this_00);
      }
      operator_delete(this_00,0x90);
      ppOVar9 = ppOVar9 + 1;
    } while (ppOVar9 !=
             (this->m_Objects).
             super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppOVar1 = (this->m_Objects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppOVar9 != ppOVar1) {
      (this->m_Objects).
      super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppOVar1;
    }
  }
  ppMVar10 = (this->m_Meshes).
             super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppMVar10 !=
      (this->m_Meshes).
      super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_01 = *ppMVar10;
      if (this_01 != (Mesh *)0x0) {
        ObjFile::Mesh::~Mesh(this_01);
      }
      operator_delete(this_01,0x70);
      ppMVar10 = ppMVar10 + 1;
    } while (ppMVar10 !=
             (this->m_Meshes).
             super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    ppMVar2 = (this->m_Meshes).
              super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppMVar10 != ppMVar2) {
      (this->m_Meshes).
      super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar2;
    }
  }
  for (p_Var7 = (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->m_Groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    puVar3 = *(undefined8 **)(p_Var7 + 2);
    if ((puVar3 != (undefined8 *)0x0) && (pvVar4 = (void *)*puVar3, pvVar4 != (void *)0x0)) {
      operator_delete(pvVar4,puVar3[2] - (long)pvVar4);
    }
    operator_delete(puVar3,0x18);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::clear(&(this->m_Groups)._M_t);
  for (p_Var7 = (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    operator_delete(*(void **)(p_Var7 + 2),0x409c);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
  ::~_Rb_tree(&(this->m_MaterialMap)._M_t);
  ppMVar10 = (this->m_Meshes).
             super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppMVar10 != (pointer)0x0) {
    operator_delete(ppMVar10,(long)(this->m_Meshes).
                                   super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppMVar10);
  }
  paVar5 = (this->m_TextureCoord).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_TextureCoord).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  pcVar6 = (this->m_strActiveGroup)._M_dataplus._M_p;
  paVar8 = &(this->m_strActiveGroup).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar8) {
    operator_delete(pcVar6,paVar8->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::~_Rb_tree(&(this->m_Groups)._M_t);
  paVar5 = (this->m_VertexColors).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_VertexColors).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  paVar5 = (this->m_Normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_Normals).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  paVar5 = (this->m_Vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar5 != (pointer)0x0) {
    operator_delete(paVar5,(long)(this->m_Vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_MaterialLib);
  ppOVar9 = (this->m_Objects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar9 != (pointer)0x0) {
    operator_delete(ppOVar9,(long)(this->m_Objects).
                                  super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar9
                   );
  }
  pcVar6 = (this->m_ModelName)._M_dataplus._M_p;
  paVar8 = &(this->m_ModelName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 == paVar8) {
    return;
  }
  operator_delete(pcVar6,paVar8->_M_allocated_capacity + 1);
  return;
}

Assistant:

~Model() {
        // Clear all stored object instances
        for (std::vector<Object*>::iterator it = m_Objects.begin();
            it != m_Objects.end(); ++it) {
            delete *it;
        }
        m_Objects.clear();

        // Clear all stored mesh instances
        for (std::vector<Mesh*>::iterator it = m_Meshes.begin();
            it != m_Meshes.end(); ++it) {
            delete *it;
        }
        m_Meshes.clear();

        for(GroupMapIt it = m_Groups.begin(); it != m_Groups.end(); ++it) {
            delete it->second;
        }
        m_Groups.clear();

        for ( std::map<std::string, Material*>::iterator it = m_MaterialMap.begin(); it != m_MaterialMap.end(); ++it ) {
            delete it->second;
        }
    }